

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O2

void __thiscall
cali::NodeBuffer::for_each(NodeBuffer *this,function<void_(const_cali::NodeBuffer::NodeInfo_&)> *fn)

{
  uint64_t uVar1;
  uint64_t size;
  ulong uVar2;
  cali_attr_type type;
  uchar *buf;
  size_t i;
  ulong uVar3;
  NodeInfo ret;
  size_t local_68;
  function<void_(const_cali::NodeBuffer::NodeInfo_&)> *local_60;
  NodeInfo local_58;
  
  uVar2 = 0;
  uVar3 = 0;
  local_60 = fn;
  while ((uVar3 < this->m_count && (uVar2 < this->m_pos))) {
    local_58.parent_id = 0xffffffffffffffff;
    buf = this->m_buffer + uVar2;
    local_68 = 0;
    uVar1 = vldec_u64(buf,&local_68);
    local_58.node_id = uVar1 >> 1;
    local_58.attr_id = vldec_u64(buf + local_68,&local_68);
    if ((uVar1 & 1) != 0) {
      local_58.parent_id = vldec_u64(buf + local_68,&local_68);
    }
    uVar1 = vldec_u64(buf + local_68,&local_68);
    size = vldec_u64(buf + local_68,&local_68);
    type = (cali_attr_type)uVar1;
    if (9 < uVar1) {
      type = CALI_TYPE_INV;
    }
    local_58.value.m_v = cali_make_variant(type,buf + local_68,size);
    uVar2 = uVar2 + size + local_68;
    std::function<void_(const_cali::NodeBuffer::NodeInfo_&)>::operator()(local_60,&local_58);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void NodeBuffer::for_each(const std::function<void(const NodeInfo&)> fn) const
{
    size_t pos = 0;

    for (size_t i = 0; i < m_count && pos < m_pos; ++i)
        fn(::unpack_node(m_buffer + pos, &pos));
}